

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitation_impl.hpp
# Opt level: O0

result_type
boost::detail::variant::
visitation_impl_invoke<boost::detail::variant::destroyer,void*,spartsi::node,boost::variant<spartsi::node,spartsi::ref_node>::has_fallback_type_>
          (undefined4 internal_which,undefined8 visitor,undefined8 storage,undefined8 t)

{
  int param_5_local;
  node *t_local;
  void *storage_local;
  destroyer *visitor_local;
  int internal_which_local;
  
  visitation_impl_invoke_impl<boost::detail::variant::destroyer,void*,spartsi::node>
            (internal_which,visitor,storage,t);
  return;
}

Assistant:

visitation_impl_invoke(
      int internal_which, Visitor& visitor, VoidPtrCV storage, T* t
    , NoBackupFlag
    , int
    )
{
    typedef typename mpl::or_<
          NoBackupFlag
        , is_nothrow_move_constructible<T>
        , has_nothrow_copy<T>
        >::type never_uses_backup;

    return (visitation_impl_invoke_impl)(
          internal_which, visitor, storage, t
        , never_uses_backup()
        );
}